

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
duckdb::ArrowJson::GetType(ArrowSchema *schema,ArrowSchemaMetadata *schema_metadata)

{
  bool bVar1;
  InvalidInputException *this;
  ArrowVariableSizeType local_61;
  __uniq_ptr_impl<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>_> local_60;
  string local_58;
  string format;
  
  ::std::__cxx11::string::string
            ((string *)&format,(char *)(schema_metadata->schema_metadata_map)._M_h._M_buckets,
             (allocator *)&local_58);
  bVar1 = ::std::operator==(&format,"u");
  if (bVar1) {
    LogicalType::JSON();
    local_61 = NORMAL;
    make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>((duckdb *)&local_60,&local_61);
    make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
              ((duckdb *)schema,(LogicalType *)&local_58,
               (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                *)&local_60);
  }
  else {
    bVar1 = ::std::operator==(&format,"U");
    if (bVar1) {
      LogicalType::JSON();
      local_61 = SUPER_SIZE;
      make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                ((duckdb *)&local_60,&local_61);
      make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                ((duckdb *)schema,(LogicalType *)&local_58,
                 (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                  *)&local_60);
    }
    else {
      bVar1 = ::std::operator==(&format,"vu");
      if (!bVar1) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_58,"Arrow extension type \"%s\" not supported for arrow.json",
                   (allocator *)&local_60);
        InvalidInputException::InvalidInputException<char_const*>
                  (this,&local_58,format._M_dataplus._M_p);
        __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::JSON();
      local_61 = VIEW;
      make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                ((duckdb *)&local_60,&local_61);
      make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                ((duckdb *)schema,(LogicalType *)&local_58,
                 (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                  *)&local_60);
    }
  }
  if (local_60._M_t.
      super__Tuple_impl<0UL,_duckdb::ArrowStringInfo_*,_std::default_delete<duckdb::ArrowStringInfo>_>
      .super__Head_base<0UL,_duckdb::ArrowStringInfo_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::ArrowStringInfo_*,_std::default_delete<duckdb::ArrowStringInfo>_>)
      0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_duckdb::ArrowStringInfo_*,_std::default_delete<duckdb::ArrowStringInfo>_>
                          .super__Head_base<0UL,_duckdb::ArrowStringInfo_*,_false>._M_head_impl + 8)
    )();
  }
  LogicalType::~LogicalType((LogicalType *)&local_58);
  ::std::__cxx11::string::~string((string *)&format);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)schema;
}

Assistant:

static unique_ptr<ArrowType> GetType(const ArrowSchema &schema, const ArrowSchemaMetadata &schema_metadata) {
		const auto format = string(schema.format);
		if (format == "u") {
			return make_uniq<ArrowType>(LogicalType::JSON(), make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL));
		} else if (format == "U") {
			return make_uniq<ArrowType>(LogicalType::JSON(),
			                            make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE));
		} else if (format == "vu") {
			return make_uniq<ArrowType>(LogicalType::JSON(), make_uniq<ArrowStringInfo>(ArrowVariableSizeType::VIEW));
		}
		throw InvalidInputException("Arrow extension type \"%s\" not supported for arrow.json", format.c_str());
	}